

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall
TTD::EventLog::ReplayExternalCallEvent
          (EventLog *this,JavascriptFunction *function,Arguments *args,Var *result)

{
  Type ppvVar1;
  bool bVar2;
  ScriptContext *scriptContext;
  ThreadContextTTD *executeContext;
  ThreadContext *pTVar3;
  long lVar4;
  TTEventListLink *pTVar5;
  ExternalCallEventLogEntry *pEVar6;
  EventLogEntry *pEVar7;
  Var pvVar8;
  RecyclableData *pRVar9;
  JavascriptExceptionObject *exceptionObject;
  RecyclableObject *pRVar10;
  undefined8 uVar11;
  uint count;
  void *__frameAddr;
  uint uVar12;
  ThreadContext *this_00;
  ulong uVar13;
  undefined1 local_70 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  if (result == (Var *)0x0) {
    TTDAbort_unrecoverable_error("Must be non-null!!!");
  }
  if (*result != (Var)0x0) {
    TTDAbort_unrecoverable_error("And initialized to a default value.");
  }
  pEVar6 = ReplayGetReplayEvent_Helper<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                     (this);
  scriptContext =
       (((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
       ->super_JavascriptLibraryBase).scriptContext.ptr;
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("Not sure how this would be possible but check just in case.");
  }
  __leaveScriptObject._32_8_ = result;
  if ((*(uint *)&args->Info & 0xffffff) + 1 != pEVar6->ArgCount) {
    TTDAbort_unrecoverable_error("Mismatch in args!!!");
  }
  executeContext = scriptContext->threadContext->TTDContext;
  NSLogEvents::PassVarToHostInReplay(executeContext,*pEVar6->ArgArray,function);
  uVar12 = SUB84(args->Info,0);
  if (((ulong)args->Info & 0xffffff) == 0) {
    count = 0;
  }
  else {
    uVar13 = 0;
    do {
      ppvVar1 = args->Values + uVar13;
      lVar4 = uVar13 + 1;
      uVar13 = uVar13 + 1;
      NSLogEvents::PassVarToHostInReplay(executeContext,pEVar6->ArgArray[lVar4],*ppvVar1);
      uVar12 = SUB84(args->Info,0);
    } while (uVar13 < (uVar12 & 0xffffff));
    count = uVar12 & 0xffffff;
  }
  if ((uVar12 >> 0x1e & 1) == 0) {
    if (pEVar6->NewTarget == (TTDVar)0x0) {
LAB_008d2da2:
      Js::LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_70,scriptContext,
                 &stack0xfffffffffffffff8);
      pTVar3 = scriptContext->threadContext;
      bVar2 = pTVar3->reentrancySafeOrHandled;
      pTVar3->reentrancySafeOrHandled = true;
      lVar4 = pEVar6->LastNestedEventTime;
      this_00 = pTVar3;
      if (this->m_eventTimeCtr <= lVar4) {
        do {
          ReplaySingleActionEventEntry(this);
        } while (this->m_eventTimeCtr <= lVar4);
        this_00 = scriptContext->threadContext;
      }
      ThreadContext::DisposeOnLeaveScript(this_00);
      pTVar3->reentrancySafeOrHandled = bVar2;
      Js::LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_70);
      pTVar5 = (this->m_currentReplayEventIterator).m_currLink;
      if ((((pTVar5 != (TTEventListLink *)0x0) &&
           (uVar13 = (this->m_currentReplayEventIterator).m_currIdx, pTVar5->StartPos <= uVar13)) &&
          (uVar13 < pTVar5->CurrPos)) &&
         (pEVar7 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator),
         pEVar7->EventTimeStamp != this->m_eventTimeCtr)) {
        TTDAbort_unrecoverable_error("Out of Sync!!!");
      }
      pvVar8 = NSLogEvents::InflateVarInReplay(executeContext,pEVar6->ReturnValue);
      uVar11 = __leaveScriptObject._32_8_;
      *(Var *)__leaveScriptObject._32_8_ = pvVar8;
      if (pEVar6->CheckExceptionStatus == true) {
        pRVar9 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                           (&scriptContext->threadContext->recyclableData);
        if ((pRVar9->exceptionObject).ptr != (JavascriptExceptionObject *)0x0) {
          local_70[0] = false;
          exceptionObject =
               Js::ScriptContext::GetAndClearRecordedException(scriptContext,(bool *)local_70);
          if (exceptionObject != (JavascriptExceptionObject *)0x0) {
            pRVar9 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                               (&scriptContext->threadContext->recyclableData);
            if (exceptionObject != &pRVar9->terminatedErrorObject) {
              Js::JavascriptExceptionOperators::RethrowExceptionObject
                        (exceptionObject,scriptContext,local_70[0]);
            }
            uVar11 = __cxa_allocate_exception(1);
            __cxa_throw(uVar11,&Js::ScriptAbortException::typeinfo,0);
          }
        }
        pvVar8 = *(Var *)uVar11;
      }
      if (pvVar8 == (Var)0x0) {
        pRVar10 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        pRVar10 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pvVar8,false);
      }
      *(RecyclableObject **)uVar11 = pRVar10;
      return;
    }
  }
  else if (pEVar6->NewTarget != (TTDVar)0x0) {
    pvVar8 = Js::CallInfo::GetNewTarget(uVar12 >> 0x18,args->Values,count);
    NSLogEvents::PassVarToHostInReplay(executeContext,pEVar6->NewTarget,pvVar8);
    goto LAB_008d2da2;
  }
  TTDAbort_unrecoverable_error("Mismatch in new.target!!!");
}

Assistant:

void EventLog::ReplayExternalCallEvent(Js::JavascriptFunction* function, const Js::Arguments& args, Js::Var* result)
    {
        TTDAssert(result != nullptr, "Must be non-null!!!");
        TTDAssert(*result == nullptr, "And initialized to a default value.");

        const NSLogEvents::ExternalCallEventLogEntry* ecEvent = this->ReplayGetReplayEvent_Helper<NSLogEvents::ExternalCallEventLogEntry, NSLogEvents::EventKind::ExternalCallTag>();

        Js::ScriptContext* ctx = function->GetScriptContext();
        TTDAssert(ctx != nullptr, "Not sure how this would be possible but check just in case.");

        ThreadContextTTD* executeContext = ctx->GetThreadContext()->TTDContext;

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteCall(function, true, args.Info.Count, args.Values, this->GetLastEventTime());
#endif

        //make sure we log all of the passed arguments in the replay host
        TTDAssert(args.Info.Count + 1 == ecEvent->ArgCount, "Mismatch in args!!!");

        TTDVar recordedFunction = ecEvent->ArgArray[0];
        NSLogEvents::PassVarToHostInReplay(executeContext, recordedFunction, function);

        for(uint32 i = 0; i < args.Info.Count; ++i)
        {
            Js::Var replayVar = args.Values[i];
            TTDVar recordedVar = ecEvent->ArgArray[i + 1];
            NSLogEvents::PassVarToHostInReplay(executeContext, recordedVar, replayVar);
        }

        if (args.HasNewTarget())
        {
            TTDAssert(ecEvent->NewTarget != nullptr, "Mismatch in new.target!!!");
            Js::Var replayVar = args.GetNewTarget();
            TTDVar recordedVar = ecEvent->NewTarget;
            NSLogEvents::PassVarToHostInReplay(executeContext, recordedVar, replayVar);
        }
        else
        {
            TTDAssert(ecEvent->NewTarget == nullptr, "Mismatch in new.target!!!");
        }

        //replay anything that happens in the external call
        BEGIN_LEAVE_SCRIPT(ctx)
        {
            this->ReplayActionEventSequenceThroughTime(ecEvent->LastNestedEventTime);
        }
        END_LEAVE_SCRIPT(ctx);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        TTDAssert(!this->m_currentReplayEventIterator.IsValid() || this->m_currentReplayEventIterator.Current()->EventTimeStamp == this->m_eventTimeCtr, "Out of Sync!!!");
#endif

        *result = NSLogEvents::InflateVarInReplay(executeContext, ecEvent->ReturnValue);

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteReturn(function, *result, this->GetLastEventTime());
#endif

        //if we had exception info then we need to patch it up and do what the external call did
        if(ecEvent->CheckExceptionStatus)
        {
            if(ctx->HasRecordedException())
            {
                bool considerPassingToDebugger = false;
                Js::JavascriptExceptionObject* recordedException = ctx->GetAndClearRecordedException(&considerPassingToDebugger);
                if(recordedException != nullptr)
                {
                    // If this is script termination, then throw ScriptAbortExceptio, else throw normal Exception object.
                    if(recordedException == ctx->GetThreadContext()->GetPendingTerminatedErrorObject())
                    {
                        throw Js::ScriptAbortException();
                    }
                    else
                    {
                        Js::JavascriptExceptionOperators::RethrowExceptionObject(recordedException, ctx, considerPassingToDebugger);
                    }
                }
            }
        }

        if(*result == nullptr)
        {
            *result = ctx->GetLibrary()->GetUndefined();
        }
        else
        {
            *result = Js::CrossSite::MarshalVar(ctx, *result);
        }
    }